

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

Var Js::JavascriptMap::EntrySet(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *pJVar6;
  double value_00;
  RecyclableObject *local_90;
  RecyclableObject *local_88;
  JavascriptMap *local_80;
  Var value;
  Var key;
  JavascriptMap *map;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0xed,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptMap>((Var)callInfo_local);
  if (bVar2) {
    local_80 = UnsafeVarTo<Js::JavascriptMap>((Var)callInfo_local);
  }
  else {
    local_80 = (JavascriptMap *)0x0;
  }
  if (local_80 != (JavascriptMap *)0x0) {
    if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
      pJVar6 = ScriptContext::GetLibrary(pSVar4);
      local_88 = JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
    }
    else {
      local_88 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
    }
    value = local_88;
    if (((uint)scriptContext & 0xffffff) < 3) {
      pJVar6 = ScriptContext::GetLibrary(pSVar4);
      local_90 = JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
    }
    else {
      local_90 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,2);
    }
    bVar2 = JavascriptNumber::Is(local_88);
    if (bVar2) {
      value_00 = JavascriptNumber::GetValue(local_88);
      BVar3 = JavascriptNumber::IsNegZero(value_00);
      if (BVar3 != 0) {
        value = JavascriptNumber::New(0.0,pSVar4);
      }
    }
    Set(local_80,value,local_90);
    return local_80;
  }
  JavascriptError::ThrowTypeErrorVar(pSVar4,-0x7ff5ec04,L"Map.prototype.set",L"Map");
}

Assistant:

Var JavascriptMap::EntrySet(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.set"), _u("Map"));
    }

    Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
    Var value = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    if (JavascriptNumber::Is(key) && JavascriptNumber::IsNegZero(JavascriptNumber::GetValue(key)))
    {
        // Normalize -0 to +0
        key = JavascriptNumber::New(0.0, scriptContext);
    }

    map->Set(key, value);

    return map;
}